

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  char cVar1;
  size_t sVar2;
  Ch *pCVar3;
  ulong uVar4;
  char *pcVar5;
  Ch c;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  
  while( true ) {
    uVar4 = (ulong)(byte)*is->current_;
    if (0x2f < uVar4) {
      return;
    }
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) break;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  }
LAB_00173e0e:
  if (uVar4 != 0x2f) {
    return;
  }
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  pcVar5 = is->current_;
  if (*pcVar5 == '*') {
    do {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      while( true ) {
        pcVar5 = is->current_;
        if (*pcVar5 != '*') break;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        if (*is->current_ == '/') goto LAB_00173e82;
      }
    } while (*pcVar5 != '\0');
  }
  else if (*pcVar5 == '/') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    do {
      cVar1 = *is->current_;
      if (cVar1 == '\0') goto LAB_00173e8a;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      if (cVar1 == '\n') goto LAB_00173e8a;
    } while( true );
  }
  sVar2 = is->count_;
  pCVar3 = is->buffer_;
  *(undefined4 *)(this + 0x30) = 0x11;
  *(char **)(this + 0x38) = pcVar5 + (sVar2 - (long)pCVar3);
  return;
LAB_00173e82:
  do {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
LAB_00173e8a:
    uVar4 = (ulong)(byte)*is->current_;
    if (0x2f < uVar4) {
      return;
    }
  } while ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0);
  goto LAB_00173e0e;
}

Assistant:

void SkipWhitespaceAndComments(InputStream& is) {
        SkipWhitespace(is);

        if (parseFlags & kParseCommentsFlag) {
            while (RAPIDJSON_UNLIKELY(Consume(is, '/'))) {
                if (Consume(is, '*')) {
                    while (true) {
                        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
                            RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());
                        else if (Consume(is, '*')) {
                            if (Consume(is, '/'))
                                break;
                        }
                        else
                            is.Take();
                    }
                }
                else if (RAPIDJSON_LIKELY(Consume(is, '/')))
                    while (is.Peek() != '\0' && is.Take() != '\n') {}
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());

                SkipWhitespace(is);
            }
        }
    }